

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O0

void __thiscall ColorToGray::handleToken(ColorToGray *this,Token *token)

{
  Token *this_00;
  bool bVar1;
  token_type_e tVar2;
  reference pvVar3;
  size_type sVar4;
  bool local_ca;
  bool local_c9;
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  double local_78;
  double gray;
  double b;
  double g;
  double r;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  token_type_e local_1c;
  Token *pTStack_18;
  token_type_e token_type;
  Token *token_local;
  ColorToGray *this_local;
  
  pTStack_18 = token;
  token_local = (Token *)this;
  while( true ) {
    bVar1 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::empty
                      (&this->all_stack);
    local_c9 = false;
    if (!bVar1) {
      pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                         (&this->all_stack,0);
      tVar2 = QPDFTokenizer::Token::getType(pvVar3);
      local_c9 = isIgnorable(this,tVar2);
    }
    if (local_c9 == false) break;
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(&this->all_stack,0);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front
              (&this->all_stack);
  }
  std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::push_back
            (&this->all_stack,pTStack_18);
  local_1c = QPDFTokenizer::Token::getType(pTStack_18);
  bVar1 = isIgnorable(this,local_1c);
  if (!bVar1) {
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::push_back
              (&this->stack,pTStack_18);
    sVar4 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::size
                      (&this->stack);
    this_00 = pTStack_18;
    local_42 = 0;
    r._3_1_ = 0;
    local_ca = false;
    if (sVar4 == 4) {
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"rg",&local_41);
      r._3_1_ = 1;
      bVar1 = QPDFTokenizer::Token::isWord(this_00,&local_40);
      local_ca = false;
      if (bVar1) {
        pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                           (&this->stack,0);
        tVar2 = QPDFTokenizer::Token::getType(pvVar3);
        bVar1 = isNumeric(this,tVar2);
        local_ca = false;
        if (bVar1) {
          pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                             (&this->stack,1);
          tVar2 = QPDFTokenizer::Token::getType(pvVar3);
          bVar1 = isNumeric(this,tVar2);
          local_ca = false;
          if (bVar1) {
            pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                               (&this->stack,2);
            tVar2 = QPDFTokenizer::Token::getType(pvVar3);
            local_ca = isNumeric(this,tVar2);
          }
        }
      }
    }
    if ((r._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator(&local_41);
    }
    if (local_ca != false) {
      pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                         (&this->stack,0);
      g = numericValue(this,pvVar3);
      pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                         (&this->stack,1);
      b = numericValue(this,pvVar3);
      pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                         (&this->stack,2);
      gray = numericValue(this,pvVar3);
      local_78 = b * 0.11 + g * 0.3 + gray * 0.59;
      if (1.0 < local_78) {
        local_78 = 1.0;
      }
      if (local_78 < 0.0) {
        local_78 = 0.0;
      }
      QUtil::double_to_string_abi_cxx11_(local_78,(int)local_98,true);
      QPDFObjectHandle::TokenFilter::write((string *)this);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b8," g",&local_b9);
      QPDFObjectHandle::TokenFilter::write((string *)this);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::clear(&this->stack);
      std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::clear
                (&this->all_stack);
    }
  }
  sVar4 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::size
                    (&this->stack);
  if (sVar4 == 4) {
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(&this->all_stack,0);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front
              (&this->all_stack);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front(&this->stack)
    ;
  }
  return;
}

Assistant:

void
ColorToGray::handleToken(QPDFTokenizer::Token const& token)
{
    // Track the number of non-ignorable tokens we've seen. If we see an "rg" following three
    // numbers, convert it to a grayscale value. Keep writing tokens to the output as we can.

    // There are several things to notice here. We keep two stacks: one of "meaningful" tokens, and
    // one of all tokens. This way we can preserve whitespace or comments that we encounter in the
    // stream and there preserve layout. As we receive tokens, we keep the last four meaningful
    // tokens. If we see three numbers followed by rg, we use the three numbers to calculate a gray
    // value that is perceptually similar to the color value and then write the "g" operator to the
    // output, discarding any spaces or comments encountered embedded in the "rg" operator.

    // The stack and all_stack members are updated in such a way that they always contain exactly
    // the same non-ignorable tokens. The stack member contains the tokens that would be left if you
    // removed all space and comment tokens from all_stack.

    // On each new token, flush out any space or comment tokens. Store the incoming token. If we
    // just got an rg preceded by the right kinds of operands, replace the command. Flush any
    // additional accumulated tokens to keep the stack only four tokens deep.

    while ((!this->all_stack.empty()) && isIgnorable(this->all_stack.at(0).getType())) {
        writeToken(this->all_stack.at(0));
        this->all_stack.pop_front();
    }
    this->all_stack.push_back(token);
    QPDFTokenizer::token_type_e token_type = token.getType();
    if (!isIgnorable(token_type)) {
        this->stack.push_back(token);
        if ((this->stack.size() == 4) && token.isWord("rg") &&
            (isNumeric(this->stack.at(0).getType())) && (isNumeric(this->stack.at(1).getType())) &&
            (isNumeric(this->stack.at(2).getType()))) {
            double r = numericValue(this->stack.at(0));
            double g = numericValue(this->stack.at(1));
            double b = numericValue(this->stack.at(2));
            double gray = ((0.3 * r) + (0.59 * b) + (0.11 * g));
            if (gray > 1.0) {
                gray = 1.0;
            }
            if (gray < 0.0) {
                gray = 0.0;
            }
            write(QUtil::double_to_string(gray, 3));
            write(" g");
            this->stack.clear();
            this->all_stack.clear();
        }
    }
    if (this->stack.size() == 4) {
        writeToken(this->all_stack.at(0));
        this->all_stack.pop_front();
        this->stack.pop_front();
    }
}